

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_>::rehash
          (Data<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_> *this,size_t sizeHint)

{
  Entry *key;
  ulong uVar1;
  Span *pSVar2;
  QGesture *pQVar3;
  Data *pDVar4;
  Node<QGesture_*,_QPointer<QWidget>_> *pNVar5;
  ulong uVar6;
  ulong uVar7;
  Span *pSVar8;
  size_t index;
  long lVar9;
  size_t numBuckets;
  long lVar10;
  R RVar11;
  Bucket BVar12;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar9 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar9 ^ 0x3f) & 0x3f);
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar11 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar11.spans;
  this->numBuckets = numBuckets;
  if (0x7f < uVar1) {
    uVar6 = 0;
    pSVar8 = pSVar2;
    do {
      lVar9 = 0;
      do {
        if ((ulong)pSVar8->offsets[lVar9] != 0xff) {
          key = pSVar2[uVar6].entries + pSVar8->offsets[lVar9];
          pQVar3 = *(QGesture **)(key->storage).data;
          uVar7 = ((ulong)pQVar3 >> 0x20 ^ (ulong)pQVar3) * -0x2917014799a6026d;
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          BVar12 = Data<QHashPrivate::Node<QGesture*,QPointer<QWidget>>>::
                   findBucketWithHash<QGesture*>
                             ((Data<QHashPrivate::Node<QGesture*,QPointer<QWidget>>> *)this,
                              (QGesture **)key,uVar7 >> 0x20 ^ this->seed ^ uVar7);
          pNVar5 = Span<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_>::insert
                             (BVar12.span,BVar12.index);
          pDVar4 = *(Data **)((key->storage).data + 8);
          pNVar5->key = *(QGesture **)(key->storage).data;
          (pNVar5->value).wp.d = pDVar4;
          (pNVar5->value).wp.value = *(QObject **)((key->storage).data + 0x10);
          *(QGesture **)((key->storage).data + 8) = (QGesture *)0x0;
          *(QGesture **)((key->storage).data + 0x10) = (QGesture *)0x0;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      Span<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_>::freeData(pSVar2 + uVar6);
      uVar6 = uVar6 + 1;
      pSVar8 = pSVar8 + 1;
    } while (uVar6 != uVar1 >> 7);
  }
  if (pSVar2 != (Span *)0x0) {
    lVar9 = *(long *)&pSVar2[-1].allocated;
    if (lVar9 != 0) {
      lVar10 = lVar9 * 0x90;
      do {
        Span<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_>::freeData
                  ((Span<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_> *)
                   (pSVar2[-1].offsets + lVar10));
        lVar10 = lVar10 + -0x90;
      } while (lVar10 != 0);
    }
    operator_delete__(&pSVar2[-1].allocated,lVar9 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }